

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test8::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test8 *this,_test_case *test_case)

{
  ostream *poVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _test_case *local_20;
  _test_case *test_case_local;
  GPUShaderFP64Test8 *this_local;
  
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (GPUShaderFP64Test8 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,"#version 420\n\nvoid main()\n{\n");
  getGeneralBody_abi_cxx11_(&local_1d8,this,local_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  std::operator<<(poVar1,"}\n\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test8::getVertexShaderBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form the body */
	result_sstream << "#version 420\n"
					  "\n"
					  "void main()\n"
					  "{\n"
				   << getGeneralBody(test_case) << "}\n"
												   "\n";

	return result_sstream.str();
}